

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::iterate(UploadWaitDrawCase *this)

{
  int iVar1;
  TargetBuffer TVar2;
  UploadMethod UVar3;
  pointer pSVar4;
  pointer pRVar5;
  void *__src;
  RenderContext *context;
  bool bVar6;
  char cVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  deUint64 dVar10;
  deUint64 dVar11;
  deUint64 dVar12;
  undefined4 extraout_var_00;
  long lVar13;
  void *__dest;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Exception *this_00;
  undefined8 *puVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  undefined4 uVar21;
  undefined8 uVar22;
  int iVar23;
  float fVar24;
  Surface resultSurface;
  float local_a4;
  Surface local_88;
  pointer local_70;
  long local_68;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  undefined4 extraout_var_01;
  int iVar20;
  
  iVar8 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_68 = CONCAT44(extraout_var,iVar8);
  iVar8 = this->m_frameNdx;
  this->m_frameNdx = iVar8 + 1;
  iVar1 = (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[this->m_sampleNdx];
  dVar10 = deGetMicroseconds();
  local_a4 = *tcu::warmupCPUInternal::g_dummy;
  iVar23 = 500;
  do {
    iVar15 = iVar23;
    dVar11 = deGetMicroseconds();
    if (dVar10 + 8000 <= dVar11) break;
    dVar11 = deGetMicroseconds();
    if (iVar15 < 1) {
      fVar24 = 123.0;
    }
    else {
      iVar19 = 0x7b;
      iVar23 = iVar15;
      do {
        local_a4 = cosf((float)iVar19 + local_a4);
        iVar16 = (int)(local_a4 * 10.0);
        iVar20 = -iVar16;
        if (0 < iVar16) {
          iVar20 = iVar16;
        }
        iVar19 = iVar20 + ((iVar19 + 0x3f) / 0x6b) * -0x6b + iVar19 + 0x3f;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
      fVar24 = (float)iVar19;
    }
    local_a4 = local_a4 + fVar24;
    dVar12 = deGetMicroseconds();
    iVar23 = iVar15 * 2;
  } while (dVar12 - dVar11 < 1000);
  while (dVar11 = deGetMicroseconds(), dVar11 < dVar10 + 8000) {
    if (iVar15 < 1) {
      fVar24 = 123.0;
    }
    else {
      iVar19 = 0x7b;
      iVar23 = iVar15;
      do {
        local_a4 = cosf((float)iVar19 + local_a4);
        iVar16 = (int)(local_a4 * 10.0);
        iVar20 = -iVar16;
        if (0 < iVar16) {
          iVar20 = iVar16;
        }
        iVar19 = iVar20 + ((iVar19 + 0x3f) / 0x6b) * -0x6b + iVar19 + 0x3f;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
      fVar24 = (float)iVar19;
    }
    local_a4 = local_a4 + fVar24;
  }
  *tcu::warmupCPUInternal::g_dummy = local_a4;
  if (iVar8 != (this->m_samples).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar1].numFrames) {
    iVar23 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar23) + 0x40))(0x8892,this->m_miscBuffer);
    RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
    (**(code **)(CONCAT44(extraout_var_00,iVar23) + 0x538))(4,0,this->m_numMiscVertices);
  }
  if (iVar8 == 0) {
    pSVar4 = (this->m_samples).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar5 = (this->m_results).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar23 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[3])();
    lVar13 = CONCAT44(extraout_var_01,iVar23);
    TVar2 = this->m_targetBuffer;
    if (TVar2 == TARGETBUFFER_VERTEX) {
      uVar21 = 0x8892;
      lVar17 = 0xb8;
      lVar18 = 0xb0;
    }
    else {
      if (TVar2 != TARGETBUFFER_INDEX) goto LAB_00745b3c;
      uVar21 = 0x8893;
      lVar17 = 0xd0;
      lVar18 = 200;
    }
    __src = *(void **)((long)&(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                              super_TestNode._vptr_TestNode + lVar18);
    lVar17 = *(long *)((long)&(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                              super_TestNode._vptr_TestNode + lVar17) - (long)__src;
    if (this->m_bufferState == BUFFERSTATE_EXISTING) {
      if (TVar2 == TARGETBUFFER_VERTEX) {
        dVar9 = this->m_vertexBuffer;
        uVar22 = 0x8892;
      }
      else {
        dVar9 = this->m_indexBuffer;
        uVar22 = 0x8893;
      }
      (**(code **)(lVar13 + 0x40))(uVar22,dVar9);
    }
    else if (this->m_bufferState == BUFFERSTATE_NEW) {
      if (TVar2 == TARGETBUFFER_VERTEX) {
        (**(code **)(lVar13 + 0x6c8))(1,&this->m_vertexBuffer);
        dVar9 = this->m_vertexBuffer;
        uVar22 = 0x8892;
      }
      else {
        (**(code **)(lVar13 + 0x6c8))(1,&this->m_indexBuffer);
        dVar9 = this->m_indexBuffer;
        uVar22 = 0x8893;
      }
      (**(code **)(lVar13 + 0x40))(uVar22,dVar9);
      if (this->m_uploadMethod - UPLOADMETHOD_BUFFER_SUB_DATA < 2) {
        (**(code **)(lVar13 + 0x150))(uVar21,lVar17,0,0x88e4);
      }
    }
    local_70 = pSVar4;
    dVar10 = deGetMicroseconds();
    UVar3 = this->m_uploadMethod;
    if (UVar3 == UPLOADMETHOD_MAP_BUFFER_RANGE) {
      __dest = (void *)(**(code **)(lVar13 + 0xd00))(uVar21,0,lVar17,0x2a);
      if (__dest == (void *)0x0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x30);
        local_58.super_ConstPixelBufferAccess.m_format =
             (TextureFormat)(local_58.super_ConstPixelBufferAccess.m_size.m_data + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"MapBufferRange returned NULL","");
        tcu::Exception::Exception(this_00,(string *)&local_58);
        __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      memcpy(__dest,__src,(long)(int)lVar17);
      cVar7 = (**(code **)(lVar13 + 0x1670))(uVar21);
      if (cVar7 == '\0') {
        puVar14 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar14 = &PTR__exception_00d164f8;
        __cxa_throw(puVar14,&(anonymous_namespace)::UnmapFailureError::typeinfo,
                    std::exception::~exception);
      }
    }
    else if (UVar3 == UPLOADMETHOD_BUFFER_SUB_DATA) {
      (**(code **)(lVar13 + 0x168))(uVar21,0,lVar17,__src);
    }
    else if (UVar3 == UPLOADMETHOD_BUFFER_DATA) {
      (**(code **)(lVar13 + 0x150))(uVar21,lVar17,__src,0x88e4);
    }
    dVar11 = deGetMicroseconds();
    local_70[iVar1].uploadCallEndTime = dVar11;
    pRVar5[iVar1].uploadDuration = dVar11 - dVar10;
  }
LAB_00745b3c:
  pSVar4 = (this->m_samples).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar23 = pSVar4[iVar1].numFrames;
  if (iVar8 == iVar23) {
    pRVar5 = (this->m_results).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar8 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar13 = CONCAT44(extraout_var_02,iVar8);
    tcu::Surface::Surface(&local_88,0x80,0x80);
    (**(code **)(lVar13 + 0x40))(0x8892,this->m_vertexBuffer);
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar13 + 0x40))(0x8893,this->m_indexBuffer);
    }
    RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
    dVar10 = deGetMicroseconds();
    pRVar5[iVar1].timeBeforeUse = dVar10 - pSVar4[iVar1].uploadCallEndTime;
    dVar10 = deGetMicroseconds();
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar13 + 0x568))(4,this->m_numVertices,0x1405,0);
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
      (**(code **)(lVar13 + 0x538))(4,0,this->m_numVertices);
    }
    dVar11 = deGetMicroseconds();
    pRVar5[iVar1].renderDuration = dVar11 - dVar10;
    dVar10 = deGetMicroseconds();
    context = ((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx;
    local_60.order = RGBA;
    local_60.type = UNORM_INT8;
    if ((void *)local_88.m_pixels.m_cap != (void *)0x0) {
      local_88.m_pixels.m_cap = (size_t)local_88.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_60,local_88.m_width,local_88.m_height,1,
               (void *)local_88.m_pixels.m_cap);
    glu::readPixels(context,0,0,&local_58);
    dVar11 = deGetMicroseconds();
    pRVar5[iVar1].readDuration = dVar11 - dVar10;
    pRVar5[iVar1].renderReadDuration = (dVar11 - dVar10) + pRVar5[iVar1].renderDuration;
    tcu::Surface::~Surface(&local_88);
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      iVar8 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      lVar13 = CONCAT44(extraout_var_03,iVar8);
      if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
        if ((anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::coloredTriangle ==
            '\0') {
          _GLOBAL__N_1::UploadWaitDrawCase::iterate();
        }
        (**(code **)(lVar13 + 0x150))
                  (0x8892,0x60,
                   (anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
                   coloredTriangle,0x88e4);
        (**(code **)(lVar13 + 0x538))(4,0,3);
        (**(code **)(lVar13 + 0x438))(1,&this->m_vertexBuffer);
        this->m_vertexBuffer = 0;
      }
      else if (this->m_targetBuffer == TARGETBUFFER_INDEX) {
        (**(code **)(lVar13 + 0x150))
                  (0x8893,0xc,
                   (anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::indices,0x88e4
                  );
        (**(code **)(lVar13 + 0x568))(4,3,0x1405,0);
        (**(code **)(lVar13 + 0x438))(1,&this->m_indexBuffer);
        this->m_indexBuffer = 0;
      }
      RenderPerformanceTestBase::waitGLResults(&this->super_RenderPerformanceTestBase);
    }
  }
  else if (iVar8 == iVar23 + 5) {
    this->m_sampleNdx = this->m_sampleNdx + 1;
    this->m_frameNdx = 0;
  }
  dVar9 = (**(code **)(local_68 + 0x800))();
  glu::checkError(dVar9,"post-iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1631);
  bVar6 = this->m_sampleNdx <
          (int)((ulong)((long)(this->m_samples).
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_samples).
                             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (!bVar6) {
    logAndSetTestResult(this);
  }
  return (uint)bVar6;
}

Assistant:

UploadWaitDrawCase::IterateResult UploadWaitDrawCase::iterate (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const int				betweenIterationDummyFrameCount = 5; // draw misc between test samples
	const int				frameNdx						= m_frameNdx++;
	const int				currentSampleNdx				= m_iterationOrder[m_sampleNdx];

	// Simulate work for about 8ms
	busyWait(8000);

	// Dummy rendering during dummy frames
	if (frameNdx != m_samples[currentSampleNdx].numFrames)
	{
		// draw similar from another buffer
		drawMisc();
	}

	if (frameNdx == 0)
	{
		// upload and start the clock
		uploadBuffer(m_samples[currentSampleNdx], m_results[currentSampleNdx]);
	}

	if (frameNdx == m_samples[currentSampleNdx].numFrames) // \note: not else if, m_samples[currentSampleNdx].numFrames can be 0
	{
		// draw using the uploaded buffer
		drawFromBuffer(m_samples[currentSampleNdx], m_results[currentSampleNdx]);

		// re-use buffer for something else to make sure test iteration do not affect each other
		if (m_bufferState == BUFFERSTATE_NEW)
			reuseAndDeleteBuffer();
	}
	else if (frameNdx == m_samples[currentSampleNdx].numFrames + betweenIterationDummyFrameCount)
	{
		// next sample
		++m_sampleNdx;
		m_frameNdx = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "post-iterate");

	if (m_sampleNdx < (int)m_samples.size())
		return CONTINUE;

	logAndSetTestResult();
	return STOP;
}